

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yescrypt-simd.c
# Opt level: O3

void blockmix_salsa8(salsa20_blk_t *Bin,salsa20_blk_t *Bout,size_t r)

{
  long lVar1;
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  long lVar5;
  int iVar6;
  uint32_t uVar7;
  int iVar19;
  int iVar20;
  __m128i Y0;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar21;
  __m128i Y1;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  uint uVar36;
  uint uVar48;
  uint uVar49;
  undefined1 auVar37 [16];
  uint uVar51;
  undefined1 auVar38 [16];
  int iVar50;
  int iVar52;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  __m128i Y3;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  uint uVar65;
  uint uVar80;
  uint uVar81;
  uint uVar82;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  uint uVar83;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  uint uVar84;
  uint uVar85;
  uint uVar101;
  uint uVar102;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  uint uVar103;
  uint uVar104;
  uint uVar119;
  uint uVar120;
  uint uVar121;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  uint uVar149;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  uint uVar150;
  int iVar163;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  int iVar164;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  
  lVar1 = r - 1;
  for (lVar5 = lVar1; lVar5 != 0; lVar5 = lVar5 + -1) {
  }
  uVar7 = Bin[lVar1 * 2 + 1].w[0];
  uVar80 = *(uint *)((long)Bin + lVar1 * 0x80 + 0x44);
  uVar82 = *(uint *)((long)Bin + lVar1 * 0x80 + 0x48);
  uVar84 = *(uint *)((long)Bin + lVar1 * 0x80 + 0x4c);
  uVar36 = *(uint *)((long)Bin + lVar1 * 0x80 + 0x50);
  uVar48 = *(uint *)((long)Bin + lVar1 * 0x80 + 0x54);
  uVar49 = *(uint *)((long)Bin + lVar1 * 0x80 + 0x58);
  uVar51 = *(uint *)((long)Bin + lVar1 * 0x80 + 0x5c);
  auVar37 = *(undefined1 (*) [16])((long)Bin + lVar1 * 0x80 + 0x60);
  lVar5 = r + (r == 0);
  auVar53 = *(undefined1 (*) [16])((long)Bin + lVar1 * 0x80 + 0x70);
  pauVar3 = (undefined1 (*) [16])(Bout->w + 0xc);
  pauVar4 = (undefined1 (*) [16])((long)Bin + 0x70);
  do {
    uVar65 = uVar7 ^ *(uint *)pauVar4[-7];
    uVar80 = uVar80 ^ *(uint *)(pauVar4[-7] + 4);
    uVar82 = uVar82 ^ *(uint *)(pauVar4[-7] + 8);
    uVar84 = uVar84 ^ *(uint *)(pauVar4[-7] + 0xc);
    uVar36 = uVar36 ^ *(uint *)pauVar4[-6];
    uVar48 = uVar48 ^ *(uint *)(pauVar4[-6] + 4);
    uVar49 = uVar49 ^ *(uint *)(pauVar4[-6] + 8);
    uVar51 = uVar51 ^ *(uint *)(pauVar4[-6] + 0xc);
    auVar53 = auVar53 ^ pauVar4[-4];
    auVar37 = auVar37 ^ pauVar4[-5];
    uVar104 = auVar53._0_4_ + uVar65;
    uVar119 = auVar53._4_4_ + uVar80;
    uVar120 = auVar53._8_4_ + uVar82;
    uVar121 = auVar53._12_4_ + uVar84;
    uVar85 = (uVar104 * 0x80 | uVar104 >> 0x19) ^ uVar36;
    uVar103 = (uVar119 * 0x80 | uVar119 >> 0x19) ^ uVar48;
    uVar101 = (uVar120 * 0x80 | uVar120 >> 0x19) ^ uVar49;
    uVar102 = (uVar121 * 0x80 | uVar121 >> 0x19) ^ uVar51;
    auVar86._0_4_ = (uVar85 + uVar65) * 0x200;
    auVar86._4_4_ = (uVar103 + uVar80) * 0x200;
    auVar86._8_4_ = (uVar101 + uVar82) * 0x200;
    auVar86._12_4_ = (uVar102 + uVar84) * 0x200;
    auVar66._0_4_ = uVar85 + uVar65 >> 0x17;
    auVar66._4_4_ = uVar103 + uVar80 >> 0x17;
    auVar66._8_4_ = uVar101 + uVar82 >> 0x17;
    auVar66._12_4_ = uVar102 + uVar84 >> 0x17;
    auVar87 = (auVar86 | auVar66) ^ auVar37;
    iVar6 = auVar87._0_4_;
    iVar19 = auVar87._4_4_;
    uVar104 = auVar87._8_4_ + uVar101;
    uVar119 = auVar87._12_4_ + uVar102;
    auVar122._0_4_ = iVar6 + uVar85 >> 0x13;
    auVar122._4_4_ = iVar19 + uVar103 >> 0x13;
    auVar122._8_4_ = uVar104 >> 0x13;
    auVar122._12_4_ = uVar119 >> 0x13;
    auVar67._0_4_ = (iVar6 + uVar85) * 0x2000;
    auVar67._4_4_ = (iVar19 + uVar103) * 0x2000;
    auVar67._8_4_ = uVar104 * 0x2000;
    auVar67._12_4_ = uVar119 * 0x2000;
    auVar68 = (auVar67 | auVar122) ^ auVar53;
    auVar133._0_12_ = auVar68._4_12_;
    auVar133._12_4_ = auVar68._0_4_;
    uVar104 = auVar68._0_4_ + iVar6;
    uVar120 = auVar68._4_4_ + iVar19;
    uVar81 = auVar68._8_4_ + auVar87._8_4_;
    uVar83 = auVar68._12_4_ + auVar87._12_4_;
    uVar119 = (uVar104 * 0x40000 | uVar104 >> 0xe) ^ uVar65;
    uVar121 = (uVar120 * 0x40000 | uVar120 >> 0xe) ^ uVar80;
    uVar149 = (uVar81 * 0x40000 | uVar81 >> 0xe) ^ uVar82;
    uVar150 = (uVar83 * 0x40000 | uVar83 >> 0xe) ^ uVar84;
    auVar90._4_4_ = uVar85;
    auVar90._0_4_ = uVar102;
    auVar90._8_4_ = uVar103;
    auVar90._12_4_ = uVar101;
    auVar105._0_4_ = (uVar102 + uVar119) * 0x80;
    auVar105._4_4_ = (uVar85 + uVar121) * 0x80;
    auVar105._8_4_ = (uVar103 + uVar149) * 0x80;
    auVar105._12_4_ = (uVar101 + uVar150) * 0x80;
    auVar123._0_4_ = uVar102 + uVar119 >> 0x19;
    auVar123._4_4_ = uVar85 + uVar121 >> 0x19;
    auVar123._8_4_ = uVar103 + uVar149 >> 0x19;
    auVar123._12_4_ = uVar101 + uVar150 >> 0x19;
    auVar123 = auVar123 ^ auVar105 ^ auVar133;
    iVar20 = auVar123._0_4_;
    iVar21 = auVar123._4_4_;
    iVar50 = auVar123._8_4_;
    iVar52 = auVar123._12_4_;
    auVar88._0_8_ = auVar87._8_8_;
    auVar88._8_4_ = iVar6;
    auVar88._12_4_ = iVar19;
    auVar134._0_4_ = (iVar20 + uVar119) * 0x200;
    auVar134._4_4_ = (iVar21 + uVar121) * 0x200;
    auVar134._8_4_ = (iVar50 + uVar149) * 0x200;
    auVar134._12_4_ = (iVar52 + uVar150) * 0x200;
    auVar106._0_4_ = iVar20 + uVar119 >> 0x17;
    auVar106._4_4_ = iVar21 + uVar121 >> 0x17;
    auVar106._8_4_ = iVar50 + uVar149 >> 0x17;
    auVar106._12_4_ = iVar52 + uVar150 >> 0x17;
    auVar106 = auVar106 ^ auVar134 ^ auVar88;
    iVar6 = auVar106._0_4_;
    iVar19 = auVar106._4_4_;
    uVar104 = auVar106._8_4_ + iVar50;
    uVar120 = auVar106._12_4_ + iVar52;
    auVar135._0_4_ = (uint)(iVar6 + iVar20) >> 0x13;
    auVar135._4_4_ = (uint)(iVar19 + iVar21) >> 0x13;
    auVar135._8_4_ = uVar104 >> 0x13;
    auVar135._12_4_ = uVar120 >> 0x13;
    auVar89._0_4_ = (iVar6 + iVar20) * 0x2000;
    auVar89._4_4_ = (iVar19 + iVar21) * 0x2000;
    auVar89._8_4_ = uVar104 * 0x2000;
    auVar89._12_4_ = uVar120 * 0x2000;
    auVar90 = (auVar89 | auVar135) ^ auVar90;
    auVar151._0_12_ = auVar90._4_12_;
    auVar151._12_4_ = auVar90._0_4_;
    uVar104 = auVar90._0_4_ + iVar6;
    uVar120 = auVar90._4_4_ + iVar19;
    uVar81 = auVar90._8_4_ + auVar106._8_4_;
    uVar83 = auVar90._12_4_ + auVar106._12_4_;
    auVar72._4_4_ = iVar20;
    auVar72._0_4_ = iVar52;
    auVar72._8_4_ = iVar21;
    auVar72._12_4_ = iVar50;
    uVar119 = (uVar104 * 0x40000 | uVar104 >> 0xe) ^ uVar119;
    uVar121 = (uVar120 * 0x40000 | uVar120 >> 0xe) ^ uVar121;
    uVar149 = (uVar81 * 0x40000 | uVar81 >> 0xe) ^ uVar149;
    uVar150 = (uVar83 * 0x40000 | uVar83 >> 0xe) ^ uVar150;
    auVar69._0_4_ = (iVar52 + uVar119) * 0x80;
    auVar69._4_4_ = (iVar20 + uVar121) * 0x80;
    auVar69._8_4_ = (iVar21 + uVar149) * 0x80;
    auVar69._12_4_ = (iVar50 + uVar150) * 0x80;
    auVar136._0_4_ = iVar52 + uVar119 >> 0x19;
    auVar136._4_4_ = iVar20 + uVar121 >> 0x19;
    auVar136._8_4_ = iVar21 + uVar149 >> 0x19;
    auVar136._12_4_ = iVar50 + uVar150 >> 0x19;
    auVar136 = auVar136 ^ auVar69 ^ auVar151;
    auVar70._0_8_ = auVar106._8_8_;
    auVar70._8_4_ = iVar6;
    auVar70._12_4_ = iVar19;
    iVar20 = auVar136._0_4_;
    iVar21 = auVar136._4_4_;
    iVar50 = auVar136._8_4_;
    iVar52 = auVar136._12_4_;
    auVar107._0_4_ = (iVar20 + uVar119) * 0x200;
    auVar107._4_4_ = (iVar21 + uVar121) * 0x200;
    auVar107._8_4_ = (iVar50 + uVar149) * 0x200;
    auVar107._12_4_ = (iVar52 + uVar150) * 0x200;
    auVar124._0_4_ = iVar20 + uVar119 >> 0x17;
    auVar124._4_4_ = iVar21 + uVar121 >> 0x17;
    auVar124._8_4_ = iVar50 + uVar149 >> 0x17;
    auVar124._12_4_ = iVar52 + uVar150 >> 0x17;
    auVar124 = auVar124 ^ auVar107 ^ auVar70;
    iVar6 = auVar124._0_4_;
    iVar19 = auVar124._4_4_;
    uVar104 = auVar124._8_4_ + iVar50;
    uVar120 = auVar124._12_4_ + iVar52;
    auVar108._0_4_ = (uint)(iVar6 + iVar20) >> 0x13;
    auVar108._4_4_ = (uint)(iVar19 + iVar21) >> 0x13;
    auVar108._8_4_ = uVar104 >> 0x13;
    auVar108._12_4_ = uVar120 >> 0x13;
    auVar71._0_4_ = (iVar6 + iVar20) * 0x2000;
    auVar71._4_4_ = (iVar19 + iVar21) * 0x2000;
    auVar71._8_4_ = uVar104 * 0x2000;
    auVar71._12_4_ = uVar120 * 0x2000;
    auVar72 = (auVar71 | auVar108) ^ auVar72;
    auVar109._0_12_ = auVar72._4_12_;
    auVar109._12_4_ = auVar72._0_4_;
    uVar104 = auVar72._0_4_ + iVar6;
    uVar120 = auVar72._4_4_ + iVar19;
    uVar81 = auVar72._8_4_ + auVar124._8_4_;
    uVar83 = auVar72._12_4_ + auVar124._12_4_;
    uVar119 = (uVar104 * 0x40000 | uVar104 >> 0xe) ^ uVar119;
    uVar121 = (uVar120 * 0x40000 | uVar120 >> 0xe) ^ uVar121;
    uVar149 = (uVar81 * 0x40000 | uVar81 >> 0xe) ^ uVar149;
    uVar150 = (uVar83 * 0x40000 | uVar83 >> 0xe) ^ uVar150;
    auVar94._4_4_ = iVar20;
    auVar94._0_4_ = iVar52;
    auVar94._8_4_ = iVar21;
    auVar94._12_4_ = iVar50;
    auVar91._0_4_ = (iVar52 + uVar119) * 0x80;
    auVar91._4_4_ = (iVar20 + uVar121) * 0x80;
    auVar91._8_4_ = (iVar21 + uVar149) * 0x80;
    auVar91._12_4_ = (iVar50 + uVar150) * 0x80;
    auVar137._0_4_ = iVar52 + uVar119 >> 0x19;
    auVar137._4_4_ = iVar20 + uVar121 >> 0x19;
    auVar137._8_4_ = iVar21 + uVar149 >> 0x19;
    auVar137._12_4_ = iVar50 + uVar150 >> 0x19;
    auVar137 = auVar137 ^ auVar91 ^ auVar109;
    iVar20 = auVar137._0_4_;
    iVar21 = auVar137._4_4_;
    iVar50 = auVar137._8_4_;
    iVar52 = auVar137._12_4_;
    auVar125._0_8_ = auVar124._8_8_;
    auVar125._8_4_ = iVar6;
    auVar125._12_4_ = iVar19;
    auVar92._0_4_ = (iVar20 + uVar119) * 0x200;
    auVar92._4_4_ = (iVar21 + uVar121) * 0x200;
    auVar92._8_4_ = (iVar50 + uVar149) * 0x200;
    auVar92._12_4_ = (iVar52 + uVar150) * 0x200;
    auVar110._0_4_ = iVar20 + uVar119 >> 0x17;
    auVar110._4_4_ = iVar21 + uVar121 >> 0x17;
    auVar110._8_4_ = iVar50 + uVar149 >> 0x17;
    auVar110._12_4_ = iVar52 + uVar150 >> 0x17;
    auVar110 = auVar110 ^ auVar92 ^ auVar125;
    iVar6 = auVar110._0_4_;
    iVar19 = auVar110._4_4_;
    uVar104 = auVar110._8_4_ + iVar50;
    uVar120 = auVar110._12_4_ + iVar52;
    auVar126._0_4_ = (uint)(iVar6 + iVar20) >> 0x13;
    auVar126._4_4_ = (uint)(iVar19 + iVar21) >> 0x13;
    auVar126._8_4_ = uVar104 >> 0x13;
    auVar126._12_4_ = uVar120 >> 0x13;
    auVar93._0_4_ = (iVar6 + iVar20) * 0x2000;
    auVar93._4_4_ = (iVar19 + iVar21) * 0x2000;
    auVar93._8_4_ = uVar104 * 0x2000;
    auVar93._12_4_ = uVar120 * 0x2000;
    auVar94 = (auVar93 | auVar126) ^ auVar94;
    auVar127._0_12_ = auVar94._4_12_;
    auVar127._12_4_ = auVar94._0_4_;
    uVar104 = auVar94._0_4_ + iVar6;
    uVar120 = auVar94._4_4_ + iVar19;
    uVar81 = auVar94._8_4_ + auVar110._8_4_;
    uVar83 = auVar94._12_4_ + auVar110._12_4_;
    auVar76._4_4_ = iVar20;
    auVar76._0_4_ = iVar52;
    auVar76._8_4_ = iVar21;
    auVar76._12_4_ = iVar50;
    uVar119 = (uVar104 * 0x40000 | uVar104 >> 0xe) ^ uVar119;
    uVar121 = (uVar120 * 0x40000 | uVar120 >> 0xe) ^ uVar121;
    uVar149 = (uVar81 * 0x40000 | uVar81 >> 0xe) ^ uVar149;
    uVar150 = (uVar83 * 0x40000 | uVar83 >> 0xe) ^ uVar150;
    auVar73._0_4_ = (iVar52 + uVar119) * 0x80;
    auVar73._4_4_ = (iVar20 + uVar121) * 0x80;
    auVar73._8_4_ = (iVar21 + uVar149) * 0x80;
    auVar73._12_4_ = (iVar50 + uVar150) * 0x80;
    auVar138._0_4_ = iVar52 + uVar119 >> 0x19;
    auVar138._4_4_ = iVar20 + uVar121 >> 0x19;
    auVar138._8_4_ = iVar21 + uVar149 >> 0x19;
    auVar138._12_4_ = iVar50 + uVar150 >> 0x19;
    auVar138 = auVar138 ^ auVar73 ^ auVar127;
    auVar74._0_8_ = auVar110._8_8_;
    auVar74._8_4_ = iVar6;
    auVar74._12_4_ = iVar19;
    iVar20 = auVar138._0_4_;
    iVar21 = auVar138._4_4_;
    iVar50 = auVar138._8_4_;
    iVar52 = auVar138._12_4_;
    auVar111._0_4_ = (iVar20 + uVar119) * 0x200;
    auVar111._4_4_ = (iVar21 + uVar121) * 0x200;
    auVar111._8_4_ = (iVar50 + uVar149) * 0x200;
    auVar111._12_4_ = (iVar52 + uVar150) * 0x200;
    auVar128._0_4_ = iVar20 + uVar119 >> 0x17;
    auVar128._4_4_ = iVar21 + uVar121 >> 0x17;
    auVar128._8_4_ = iVar50 + uVar149 >> 0x17;
    auVar128._12_4_ = iVar52 + uVar150 >> 0x17;
    auVar128 = auVar128 ^ auVar111 ^ auVar74;
    iVar6 = auVar128._0_4_;
    iVar19 = auVar128._4_4_;
    uVar104 = auVar128._8_4_ + iVar50;
    uVar120 = auVar128._12_4_ + iVar52;
    auVar112._0_4_ = (uint)(iVar6 + iVar20) >> 0x13;
    auVar112._4_4_ = (uint)(iVar19 + iVar21) >> 0x13;
    auVar112._8_4_ = uVar104 >> 0x13;
    auVar112._12_4_ = uVar120 >> 0x13;
    auVar75._0_4_ = (iVar6 + iVar20) * 0x2000;
    auVar75._4_4_ = (iVar19 + iVar21) * 0x2000;
    auVar75._8_4_ = uVar104 * 0x2000;
    auVar75._12_4_ = uVar120 * 0x2000;
    auVar76 = (auVar75 | auVar112) ^ auVar76;
    auVar113._0_12_ = auVar76._4_12_;
    auVar113._12_4_ = auVar76._0_4_;
    uVar104 = auVar76._0_4_ + iVar6;
    uVar120 = auVar76._4_4_ + iVar19;
    uVar81 = auVar76._8_4_ + auVar128._8_4_;
    uVar83 = auVar76._12_4_ + auVar128._12_4_;
    uVar119 = (uVar104 * 0x40000 | uVar104 >> 0xe) ^ uVar119;
    uVar121 = (uVar120 * 0x40000 | uVar120 >> 0xe) ^ uVar121;
    uVar149 = (uVar81 * 0x40000 | uVar81 >> 0xe) ^ uVar149;
    uVar150 = (uVar83 * 0x40000 | uVar83 >> 0xe) ^ uVar150;
    auVar98._4_4_ = iVar20;
    auVar98._0_4_ = iVar52;
    auVar98._8_4_ = iVar21;
    auVar98._12_4_ = iVar50;
    auVar95._0_4_ = (iVar52 + uVar119) * 0x80;
    auVar95._4_4_ = (iVar20 + uVar121) * 0x80;
    auVar95._8_4_ = (iVar21 + uVar149) * 0x80;
    auVar95._12_4_ = (iVar50 + uVar150) * 0x80;
    auVar139._0_4_ = iVar52 + uVar119 >> 0x19;
    auVar139._4_4_ = iVar20 + uVar121 >> 0x19;
    auVar139._8_4_ = iVar21 + uVar149 >> 0x19;
    auVar139._12_4_ = iVar50 + uVar150 >> 0x19;
    auVar139 = auVar139 ^ auVar95 ^ auVar113;
    iVar20 = auVar139._0_4_;
    iVar21 = auVar139._4_4_;
    iVar50 = auVar139._8_4_;
    iVar52 = auVar139._12_4_;
    auVar129._0_8_ = auVar128._8_8_;
    auVar129._8_4_ = iVar6;
    auVar129._12_4_ = iVar19;
    auVar96._0_4_ = (iVar20 + uVar119) * 0x200;
    auVar96._4_4_ = (iVar21 + uVar121) * 0x200;
    auVar96._8_4_ = (iVar50 + uVar149) * 0x200;
    auVar96._12_4_ = (iVar52 + uVar150) * 0x200;
    auVar114._0_4_ = iVar20 + uVar119 >> 0x17;
    auVar114._4_4_ = iVar21 + uVar121 >> 0x17;
    auVar114._8_4_ = iVar50 + uVar149 >> 0x17;
    auVar114._12_4_ = iVar52 + uVar150 >> 0x17;
    auVar114 = auVar114 ^ auVar96 ^ auVar129;
    iVar6 = auVar114._0_4_;
    iVar19 = auVar114._4_4_;
    uVar104 = auVar114._8_4_ + iVar50;
    uVar120 = auVar114._12_4_ + iVar52;
    auVar130._0_4_ = (uint)(iVar6 + iVar20) >> 0x13;
    auVar130._4_4_ = (uint)(iVar19 + iVar21) >> 0x13;
    auVar130._8_4_ = uVar104 >> 0x13;
    auVar130._12_4_ = uVar120 >> 0x13;
    auVar97._0_4_ = (iVar6 + iVar20) * 0x2000;
    auVar97._4_4_ = (iVar19 + iVar21) * 0x2000;
    auVar97._8_4_ = uVar104 * 0x2000;
    auVar97._12_4_ = uVar120 * 0x2000;
    auVar98 = (auVar97 | auVar130) ^ auVar98;
    auVar152._0_12_ = auVar98._4_12_;
    auVar152._12_4_ = auVar98._0_4_;
    uVar104 = auVar98._0_4_ + iVar6;
    uVar120 = auVar98._4_4_ + iVar19;
    uVar81 = auVar98._8_4_ + auVar114._8_4_;
    uVar83 = auVar98._12_4_ + auVar114._12_4_;
    auVar142._4_4_ = iVar20;
    auVar142._0_4_ = iVar52;
    auVar142._8_4_ = iVar21;
    auVar142._12_4_ = iVar50;
    uVar119 = (uVar104 * 0x40000 | uVar104 >> 0xe) ^ uVar119;
    uVar121 = (uVar120 * 0x40000 | uVar120 >> 0xe) ^ uVar121;
    uVar149 = (uVar81 * 0x40000 | uVar81 >> 0xe) ^ uVar149;
    uVar150 = (uVar83 * 0x40000 | uVar83 >> 0xe) ^ uVar150;
    auVar77._0_4_ = (iVar52 + uVar119) * 0x80;
    auVar77._4_4_ = (iVar20 + uVar121) * 0x80;
    auVar77._8_4_ = (iVar21 + uVar149) * 0x80;
    auVar77._12_4_ = (iVar50 + uVar150) * 0x80;
    auVar131._0_4_ = iVar52 + uVar119 >> 0x19;
    auVar131._4_4_ = iVar20 + uVar121 >> 0x19;
    auVar131._8_4_ = iVar21 + uVar149 >> 0x19;
    auVar131._12_4_ = iVar50 + uVar150 >> 0x19;
    auVar131 = auVar131 ^ auVar77 ^ auVar152;
    auVar115._0_8_ = auVar114._8_8_;
    auVar115._8_4_ = iVar6;
    auVar115._12_4_ = iVar19;
    uVar85 = auVar131._0_4_;
    uVar101 = auVar131._4_4_;
    uVar102 = auVar131._8_4_;
    uVar103 = auVar131._12_4_;
    auVar140._0_4_ = (uVar85 + uVar119) * 0x200;
    auVar140._4_4_ = (uVar101 + uVar121) * 0x200;
    auVar140._8_4_ = (uVar102 + uVar149) * 0x200;
    auVar140._12_4_ = (uVar103 + uVar150) * 0x200;
    auVar78._0_4_ = uVar85 + uVar119 >> 0x17;
    auVar78._4_4_ = uVar101 + uVar121 >> 0x17;
    auVar78._8_4_ = uVar102 + uVar149 >> 0x17;
    auVar78._12_4_ = uVar103 + uVar150 >> 0x17;
    auVar78 = auVar78 ^ auVar140 ^ auVar115;
    iVar6 = auVar78._0_4_;
    iVar19 = auVar78._4_4_;
    uVar104 = auVar78._8_4_ + uVar102;
    uVar120 = auVar78._12_4_ + uVar103;
    auVar116._0_4_ = iVar6 + uVar85 >> 0x13;
    auVar116._4_4_ = iVar19 + uVar101 >> 0x13;
    auVar116._8_4_ = uVar104 >> 0x13;
    auVar116._12_4_ = uVar120 >> 0x13;
    auVar141._0_4_ = (iVar6 + uVar85) * 0x2000;
    auVar141._4_4_ = (iVar19 + uVar101) * 0x2000;
    auVar141._8_4_ = uVar104 * 0x2000;
    auVar141._12_4_ = uVar120 * 0x2000;
    auVar142 = (auVar141 | auVar116) ^ auVar142;
    auVar153._0_12_ = auVar142._4_12_;
    auVar153._12_4_ = auVar142._0_4_;
    uVar104 = auVar142._0_4_ + iVar6;
    uVar120 = auVar142._4_4_ + iVar19;
    uVar81 = auVar142._8_4_ + auVar78._8_4_;
    uVar83 = auVar142._12_4_ + auVar78._12_4_;
    uVar119 = (uVar104 * 0x40000 | uVar104 >> 0xe) ^ uVar119;
    uVar121 = (uVar120 * 0x40000 | uVar120 >> 0xe) ^ uVar121;
    uVar149 = (uVar81 * 0x40000 | uVar81 >> 0xe) ^ uVar149;
    uVar150 = (uVar83 * 0x40000 | uVar83 >> 0xe) ^ uVar150;
    auVar99._0_4_ = (uVar103 + uVar119) * 0x80;
    auVar99._4_4_ = (uVar85 + uVar121) * 0x80;
    auVar99._8_4_ = (uVar101 + uVar149) * 0x80;
    auVar99._12_4_ = (uVar102 + uVar150) * 0x80;
    auVar117._0_4_ = uVar103 + uVar119 >> 0x19;
    auVar117._4_4_ = uVar85 + uVar121 >> 0x19;
    auVar117._8_4_ = uVar101 + uVar149 >> 0x19;
    auVar117._12_4_ = uVar102 + uVar150 >> 0x19;
    auVar117 = auVar117 ^ auVar99 ^ auVar153;
    iVar50 = auVar117._0_4_;
    iVar52 = auVar117._4_4_;
    iVar163 = auVar117._8_4_;
    iVar164 = auVar117._12_4_;
    auVar79._0_8_ = auVar78._8_8_;
    auVar79._8_4_ = iVar6;
    auVar79._12_4_ = iVar19;
    auVar100._0_4_ = (iVar50 + uVar119) * 0x200;
    auVar100._4_4_ = (iVar52 + uVar121) * 0x200;
    auVar100._8_4_ = (iVar163 + uVar149) * 0x200;
    auVar100._12_4_ = (iVar164 + uVar150) * 0x200;
    auVar154._0_4_ = iVar50 + uVar119 >> 0x17;
    auVar154._4_4_ = iVar52 + uVar121 >> 0x17;
    auVar154._8_4_ = iVar163 + uVar149 >> 0x17;
    auVar154._12_4_ = iVar164 + uVar150 >> 0x17;
    auVar154 = auVar154 ^ auVar100 ^ auVar79;
    iVar6 = auVar154._0_4_;
    iVar19 = auVar154._4_4_;
    iVar20 = auVar154._8_4_;
    iVar21 = auVar154._12_4_;
    uVar103 = ((iVar6 + iVar50) * 0x2000 | (uint)(iVar6 + iVar50) >> 0x13) ^ uVar103;
    uVar85 = ((iVar19 + iVar52) * 0x2000 | (uint)(iVar19 + iVar52) >> 0x13) ^ uVar85;
    uVar101 = ((iVar20 + iVar163) * 0x2000 | (uint)(iVar20 + iVar163) >> 0x13) ^ uVar101;
    uVar102 = ((iVar21 + iVar164) * 0x2000 | (uint)(iVar21 + iVar164) >> 0x13) ^ uVar102;
    uVar104 = uVar103 + iVar6;
    uVar120 = uVar85 + iVar19;
    uVar81 = uVar101 + iVar20;
    uVar83 = uVar102 + iVar21;
    uVar65 = ((uVar104 * 0x40000 | uVar104 >> 0xe) ^ uVar119) + uVar65;
    uVar80 = ((uVar120 * 0x40000 | uVar120 >> 0xe) ^ uVar121) + uVar80;
    uVar82 = ((uVar81 * 0x40000 | uVar81 >> 0xe) ^ uVar149) + uVar82;
    uVar84 = ((uVar83 * 0x40000 | uVar83 >> 0xe) ^ uVar150) + uVar84;
    *(uint *)pauVar3[-3] = uVar65;
    *(uint *)((long)pauVar3[-3] + 4) = uVar80;
    *(uint *)((long)pauVar3[-3] + 8) = uVar82;
    *(uint *)((long)pauVar3[-3] + 0xc) = uVar84;
    uVar85 = uVar85 + uVar36;
    uVar101 = uVar101 + uVar48;
    uVar102 = uVar102 + uVar49;
    uVar103 = uVar103 + uVar51;
    *(uint *)pauVar3[-2] = uVar85;
    *(uint *)((long)pauVar3[-2] + 4) = uVar101;
    *(uint *)((long)pauVar3[-2] + 8) = uVar102;
    *(uint *)((long)pauVar3[-2] + 0xc) = uVar103;
    auVar132._0_4_ = iVar20 + auVar37._0_4_;
    auVar132._4_4_ = iVar21 + auVar37._4_4_;
    auVar132._8_4_ = iVar6 + auVar37._8_4_;
    auVar132._12_4_ = iVar19 + auVar37._12_4_;
    pauVar3[-1] = auVar132;
    auVar118._0_4_ = iVar164 + auVar53._0_4_;
    auVar118._4_4_ = iVar50 + auVar53._4_4_;
    auVar118._8_4_ = iVar52 + auVar53._8_4_;
    auVar118._12_4_ = iVar163 + auVar53._12_4_;
    *pauVar3 = auVar118;
    auVar118 = auVar118 ^ *pauVar4;
    uVar65 = uVar65 ^ *(uint *)pauVar4[-3];
    uVar80 = uVar80 ^ *(uint *)(pauVar4[-3] + 4);
    uVar82 = uVar82 ^ *(uint *)(pauVar4[-3] + 8);
    uVar84 = uVar84 ^ *(uint *)(pauVar4[-3] + 0xc);
    uVar36 = auVar118._0_4_ + uVar65;
    uVar48 = auVar118._4_4_ + uVar80;
    uVar49 = auVar118._8_4_ + uVar82;
    uVar51 = auVar118._12_4_ + uVar84;
    uVar85 = uVar85 ^ *(uint *)pauVar4[-2];
    uVar101 = uVar101 ^ *(uint *)(pauVar4[-2] + 4);
    uVar102 = uVar102 ^ *(uint *)(pauVar4[-2] + 8);
    uVar103 = uVar103 ^ *(uint *)(pauVar4[-2] + 0xc);
    uVar119 = (uVar36 * 0x80 | uVar36 >> 0x19) ^ uVar85;
    uVar121 = (uVar48 * 0x80 | uVar48 >> 0x19) ^ uVar101;
    uVar149 = (uVar49 * 0x80 | uVar49 >> 0x19) ^ uVar102;
    uVar150 = (uVar51 * 0x80 | uVar51 >> 0x19) ^ uVar103;
    auVar68._0_4_ = uVar119 + uVar65 >> 0x17;
    auVar68._4_4_ = uVar121 + uVar80 >> 0x17;
    auVar68._8_4_ = uVar149 + uVar82 >> 0x17;
    auVar68._12_4_ = uVar150 + uVar84 >> 0x17;
    auVar22._0_4_ = (uVar119 + uVar65) * 0x200;
    auVar22._4_4_ = (uVar121 + uVar80) * 0x200;
    auVar22._8_4_ = (uVar149 + uVar82) * 0x200;
    auVar22._12_4_ = (uVar150 + uVar84) * 0x200;
    auVar132 = auVar132 ^ pauVar4[-1];
    auVar53 = (auVar22 | auVar68) ^ auVar132;
    iVar6 = auVar53._0_4_;
    iVar19 = auVar53._4_4_;
    uVar36 = auVar53._8_4_ + uVar149;
    uVar48 = auVar53._12_4_ + uVar150;
    auVar87._0_4_ = (iVar6 + uVar119) * 0x2000;
    auVar87._4_4_ = (iVar19 + uVar121) * 0x2000;
    auVar87._8_4_ = uVar36 * 0x2000;
    auVar87._12_4_ = uVar48 * 0x2000;
    auVar54._0_4_ = iVar6 + uVar119 >> 0x13;
    auVar54._4_4_ = iVar19 + uVar121 >> 0x13;
    auVar54._8_4_ = uVar36 >> 0x13;
    auVar54._12_4_ = uVar48 >> 0x13;
    auVar37 = (auVar87 | auVar54) ^ auVar118;
    auVar155._0_12_ = auVar37._4_12_;
    auVar155._12_4_ = auVar37._0_4_;
    uVar36 = auVar37._0_4_ + iVar6;
    uVar48 = auVar37._4_4_ + iVar19;
    uVar49 = auVar37._8_4_ + auVar53._8_4_;
    uVar51 = auVar37._12_4_ + auVar53._12_4_;
    uVar104 = (uVar36 * 0x40000 | uVar36 >> 0xe) ^ uVar65;
    uVar120 = (uVar48 * 0x40000 | uVar48 >> 0xe) ^ uVar80;
    uVar81 = (uVar49 * 0x40000 | uVar49 >> 0xe) ^ uVar82;
    uVar83 = (uVar51 * 0x40000 | uVar51 >> 0xe) ^ uVar84;
    auVar25._4_4_ = uVar119;
    auVar25._0_4_ = uVar150;
    auVar25._8_4_ = uVar121;
    auVar25._12_4_ = uVar149;
    auVar38._0_4_ = (uVar150 + uVar104) * 0x80;
    auVar38._4_4_ = (uVar119 + uVar120) * 0x80;
    auVar38._8_4_ = (uVar121 + uVar81) * 0x80;
    auVar38._12_4_ = (uVar149 + uVar83) * 0x80;
    auVar55._0_4_ = uVar150 + uVar104 >> 0x19;
    auVar55._4_4_ = uVar119 + uVar120 >> 0x19;
    auVar55._8_4_ = uVar121 + uVar81 >> 0x19;
    auVar55._12_4_ = uVar149 + uVar83 >> 0x19;
    auVar55 = auVar55 ^ auVar38 ^ auVar155;
    iVar20 = auVar55._0_4_;
    iVar21 = auVar55._4_4_;
    iVar50 = auVar55._8_4_;
    iVar52 = auVar55._12_4_;
    auVar23._0_8_ = auVar53._8_8_;
    auVar23._8_4_ = iVar6;
    auVar23._12_4_ = iVar19;
    auVar156._0_4_ = (iVar20 + uVar104) * 0x200;
    auVar156._4_4_ = (iVar21 + uVar120) * 0x200;
    auVar156._8_4_ = (iVar50 + uVar81) * 0x200;
    auVar156._12_4_ = (iVar52 + uVar83) * 0x200;
    auVar39._0_4_ = iVar20 + uVar104 >> 0x17;
    auVar39._4_4_ = iVar21 + uVar120 >> 0x17;
    auVar39._8_4_ = iVar50 + uVar81 >> 0x17;
    auVar39._12_4_ = iVar52 + uVar83 >> 0x17;
    auVar39 = auVar39 ^ auVar156 ^ auVar23;
    iVar6 = auVar39._0_4_;
    iVar19 = auVar39._4_4_;
    uVar36 = auVar39._8_4_ + iVar50;
    uVar48 = auVar39._12_4_ + iVar52;
    auVar157._0_4_ = (uint)(iVar6 + iVar20) >> 0x13;
    auVar157._4_4_ = (uint)(iVar19 + iVar21) >> 0x13;
    auVar157._8_4_ = uVar36 >> 0x13;
    auVar157._12_4_ = uVar48 >> 0x13;
    auVar24._0_4_ = (iVar6 + iVar20) * 0x2000;
    auVar24._4_4_ = (iVar19 + iVar21) * 0x2000;
    auVar24._8_4_ = uVar36 * 0x2000;
    auVar24._12_4_ = uVar48 * 0x2000;
    auVar25 = (auVar24 | auVar157) ^ auVar25;
    auVar158._0_12_ = auVar25._4_12_;
    auVar158._12_4_ = auVar25._0_4_;
    uVar36 = auVar25._0_4_ + iVar6;
    uVar48 = auVar25._4_4_ + iVar19;
    uVar49 = auVar25._8_4_ + auVar39._8_4_;
    uVar51 = auVar25._12_4_ + auVar39._12_4_;
    auVar11._4_4_ = iVar20;
    auVar11._0_4_ = iVar52;
    auVar11._8_4_ = iVar21;
    auVar11._12_4_ = iVar50;
    uVar104 = (uVar36 * 0x40000 | uVar36 >> 0xe) ^ uVar104;
    uVar120 = (uVar48 * 0x40000 | uVar48 >> 0xe) ^ uVar120;
    uVar81 = (uVar49 * 0x40000 | uVar49 >> 0xe) ^ uVar81;
    uVar83 = (uVar51 * 0x40000 | uVar51 >> 0xe) ^ uVar83;
    auVar8._0_4_ = (iVar52 + uVar104) * 0x80;
    auVar8._4_4_ = (iVar20 + uVar120) * 0x80;
    auVar8._8_4_ = (iVar21 + uVar81) * 0x80;
    auVar8._12_4_ = (iVar50 + uVar83) * 0x80;
    auVar56._0_4_ = iVar52 + uVar104 >> 0x19;
    auVar56._4_4_ = iVar20 + uVar120 >> 0x19;
    auVar56._8_4_ = iVar21 + uVar81 >> 0x19;
    auVar56._12_4_ = iVar50 + uVar83 >> 0x19;
    auVar56 = auVar56 ^ auVar8 ^ auVar158;
    auVar9._0_8_ = auVar39._8_8_;
    auVar9._8_4_ = iVar6;
    auVar9._12_4_ = iVar19;
    iVar20 = auVar56._0_4_;
    iVar21 = auVar56._4_4_;
    iVar50 = auVar56._8_4_;
    iVar52 = auVar56._12_4_;
    auVar159._0_4_ = (iVar20 + uVar104) * 0x200;
    auVar159._4_4_ = (iVar21 + uVar120) * 0x200;
    auVar159._8_4_ = (iVar50 + uVar81) * 0x200;
    auVar159._12_4_ = (iVar52 + uVar83) * 0x200;
    auVar40._0_4_ = iVar20 + uVar104 >> 0x17;
    auVar40._4_4_ = iVar21 + uVar120 >> 0x17;
    auVar40._8_4_ = iVar50 + uVar81 >> 0x17;
    auVar40._12_4_ = iVar52 + uVar83 >> 0x17;
    auVar40 = auVar40 ^ auVar159 ^ auVar9;
    iVar6 = auVar40._0_4_;
    iVar19 = auVar40._4_4_;
    uVar36 = auVar40._8_4_ + iVar50;
    uVar48 = auVar40._12_4_ + iVar52;
    auVar10._0_4_ = (iVar6 + iVar20) * 0x2000;
    auVar10._4_4_ = (iVar19 + iVar21) * 0x2000;
    auVar10._8_4_ = uVar36 * 0x2000;
    auVar10._12_4_ = uVar48 * 0x2000;
    auVar160._0_4_ = (uint)(iVar6 + iVar20) >> 0x13;
    auVar160._4_4_ = (uint)(iVar19 + iVar21) >> 0x13;
    auVar160._8_4_ = uVar36 >> 0x13;
    auVar160._12_4_ = uVar48 >> 0x13;
    auVar11 = (auVar10 | auVar160) ^ auVar11;
    auVar165._0_12_ = auVar11._4_12_;
    auVar165._12_4_ = auVar11._0_4_;
    uVar36 = auVar11._0_4_ + iVar6;
    uVar48 = auVar11._4_4_ + iVar19;
    uVar49 = auVar11._8_4_ + auVar40._8_4_;
    uVar51 = auVar11._12_4_ + auVar40._12_4_;
    uVar104 = (uVar36 * 0x40000 | uVar36 >> 0xe) ^ uVar104;
    uVar120 = (uVar48 * 0x40000 | uVar48 >> 0xe) ^ uVar120;
    uVar81 = (uVar49 * 0x40000 | uVar49 >> 0xe) ^ uVar81;
    uVar83 = (uVar51 * 0x40000 | uVar51 >> 0xe) ^ uVar83;
    auVar29._4_4_ = iVar20;
    auVar29._0_4_ = iVar52;
    auVar29._8_4_ = iVar21;
    auVar29._12_4_ = iVar50;
    auVar26._0_4_ = (iVar52 + uVar104) * 0x80;
    auVar26._4_4_ = (iVar20 + uVar120) * 0x80;
    auVar26._8_4_ = (iVar21 + uVar81) * 0x80;
    auVar26._12_4_ = (iVar50 + uVar83) * 0x80;
    auVar143._0_4_ = iVar52 + uVar104 >> 0x19;
    auVar143._4_4_ = iVar20 + uVar120 >> 0x19;
    auVar143._8_4_ = iVar21 + uVar81 >> 0x19;
    auVar143._12_4_ = iVar50 + uVar83 >> 0x19;
    auVar143 = auVar143 ^ auVar26 ^ auVar165;
    iVar20 = auVar143._0_4_;
    iVar21 = auVar143._4_4_;
    iVar50 = auVar143._8_4_;
    iVar52 = auVar143._12_4_;
    auVar27._0_8_ = auVar40._8_8_;
    auVar27._8_4_ = iVar6;
    auVar27._12_4_ = iVar19;
    auVar41._0_4_ = (iVar20 + uVar104) * 0x200;
    auVar41._4_4_ = (iVar21 + uVar120) * 0x200;
    auVar41._8_4_ = (iVar50 + uVar81) * 0x200;
    auVar41._12_4_ = (iVar52 + uVar83) * 0x200;
    auVar57._0_4_ = iVar20 + uVar104 >> 0x17;
    auVar57._4_4_ = iVar21 + uVar120 >> 0x17;
    auVar57._8_4_ = iVar50 + uVar81 >> 0x17;
    auVar57._12_4_ = iVar52 + uVar83 >> 0x17;
    auVar57 = auVar57 ^ auVar41 ^ auVar27;
    iVar6 = auVar57._0_4_;
    iVar19 = auVar57._4_4_;
    uVar36 = auVar57._8_4_ + iVar50;
    uVar48 = auVar57._12_4_ + iVar52;
    auVar42._0_4_ = (uint)(iVar6 + iVar20) >> 0x13;
    auVar42._4_4_ = (uint)(iVar19 + iVar21) >> 0x13;
    auVar42._8_4_ = uVar36 >> 0x13;
    auVar42._12_4_ = uVar48 >> 0x13;
    auVar28._0_4_ = (iVar6 + iVar20) * 0x2000;
    auVar28._4_4_ = (iVar19 + iVar21) * 0x2000;
    auVar28._8_4_ = uVar36 * 0x2000;
    auVar28._12_4_ = uVar48 * 0x2000;
    auVar29 = (auVar28 | auVar42) ^ auVar29;
    auVar43._0_12_ = auVar29._4_12_;
    auVar43._12_4_ = auVar29._0_4_;
    uVar36 = auVar29._0_4_ + iVar6;
    uVar48 = auVar29._4_4_ + iVar19;
    uVar49 = auVar29._8_4_ + auVar57._8_4_;
    uVar51 = auVar29._12_4_ + auVar57._12_4_;
    auVar15._4_4_ = iVar20;
    auVar15._0_4_ = iVar52;
    auVar15._8_4_ = iVar21;
    auVar15._12_4_ = iVar50;
    uVar104 = (uVar36 * 0x40000 | uVar36 >> 0xe) ^ uVar104;
    uVar120 = (uVar48 * 0x40000 | uVar48 >> 0xe) ^ uVar120;
    uVar81 = (uVar49 * 0x40000 | uVar49 >> 0xe) ^ uVar81;
    uVar83 = (uVar51 * 0x40000 | uVar51 >> 0xe) ^ uVar83;
    auVar12._0_4_ = (iVar52 + uVar104) * 0x80;
    auVar12._4_4_ = (iVar20 + uVar120) * 0x80;
    auVar12._8_4_ = (iVar21 + uVar81) * 0x80;
    auVar12._12_4_ = (iVar50 + uVar83) * 0x80;
    auVar144._0_4_ = iVar52 + uVar104 >> 0x19;
    auVar144._4_4_ = iVar20 + uVar120 >> 0x19;
    auVar144._8_4_ = iVar21 + uVar81 >> 0x19;
    auVar144._12_4_ = iVar50 + uVar83 >> 0x19;
    auVar144 = auVar144 ^ auVar12 ^ auVar43;
    auVar13._0_8_ = auVar57._8_8_;
    auVar13._8_4_ = iVar6;
    auVar13._12_4_ = iVar19;
    iVar20 = auVar144._0_4_;
    iVar21 = auVar144._4_4_;
    iVar50 = auVar144._8_4_;
    iVar52 = auVar144._12_4_;
    auVar58._0_4_ = (iVar20 + uVar104) * 0x200;
    auVar58._4_4_ = (iVar21 + uVar120) * 0x200;
    auVar58._8_4_ = (iVar50 + uVar81) * 0x200;
    auVar58._12_4_ = (iVar52 + uVar83) * 0x200;
    auVar44._0_4_ = iVar20 + uVar104 >> 0x17;
    auVar44._4_4_ = iVar21 + uVar120 >> 0x17;
    auVar44._8_4_ = iVar50 + uVar81 >> 0x17;
    auVar44._12_4_ = iVar52 + uVar83 >> 0x17;
    auVar44 = auVar44 ^ auVar58 ^ auVar13;
    iVar6 = auVar44._0_4_;
    iVar19 = auVar44._4_4_;
    uVar36 = auVar44._8_4_ + iVar50;
    uVar48 = auVar44._12_4_ + iVar52;
    auVar14._0_4_ = (iVar6 + iVar20) * 0x2000;
    auVar14._4_4_ = (iVar19 + iVar21) * 0x2000;
    auVar14._8_4_ = uVar36 * 0x2000;
    auVar14._12_4_ = uVar48 * 0x2000;
    auVar59._0_4_ = (uint)(iVar6 + iVar20) >> 0x13;
    auVar59._4_4_ = (uint)(iVar19 + iVar21) >> 0x13;
    auVar59._8_4_ = uVar36 >> 0x13;
    auVar59._12_4_ = uVar48 >> 0x13;
    auVar15 = (auVar14 | auVar59) ^ auVar15;
    auVar60._0_12_ = auVar15._4_12_;
    auVar60._12_4_ = auVar15._0_4_;
    uVar36 = auVar15._0_4_ + iVar6;
    uVar48 = auVar15._4_4_ + iVar19;
    uVar49 = auVar15._8_4_ + auVar44._8_4_;
    uVar51 = auVar15._12_4_ + auVar44._12_4_;
    uVar104 = (uVar36 * 0x40000 | uVar36 >> 0xe) ^ uVar104;
    uVar120 = (uVar48 * 0x40000 | uVar48 >> 0xe) ^ uVar120;
    uVar81 = (uVar49 * 0x40000 | uVar49 >> 0xe) ^ uVar81;
    uVar83 = (uVar51 * 0x40000 | uVar51 >> 0xe) ^ uVar83;
    auVar33._4_4_ = iVar20;
    auVar33._0_4_ = iVar52;
    auVar33._8_4_ = iVar21;
    auVar33._12_4_ = iVar50;
    auVar30._0_4_ = (iVar52 + uVar104) * 0x80;
    auVar30._4_4_ = (iVar20 + uVar120) * 0x80;
    auVar30._8_4_ = (iVar21 + uVar81) * 0x80;
    auVar30._12_4_ = (iVar50 + uVar83) * 0x80;
    auVar145._0_4_ = iVar52 + uVar104 >> 0x19;
    auVar145._4_4_ = iVar20 + uVar120 >> 0x19;
    auVar145._8_4_ = iVar21 + uVar81 >> 0x19;
    auVar145._12_4_ = iVar50 + uVar83 >> 0x19;
    auVar145 = auVar145 ^ auVar30 ^ auVar60;
    iVar20 = auVar145._0_4_;
    iVar21 = auVar145._4_4_;
    iVar50 = auVar145._8_4_;
    iVar52 = auVar145._12_4_;
    auVar31._0_8_ = auVar44._8_8_;
    auVar31._8_4_ = iVar6;
    auVar31._12_4_ = iVar19;
    auVar45._0_4_ = (iVar20 + uVar104) * 0x200;
    auVar45._4_4_ = (iVar21 + uVar120) * 0x200;
    auVar45._8_4_ = (iVar50 + uVar81) * 0x200;
    auVar45._12_4_ = (iVar52 + uVar83) * 0x200;
    auVar61._0_4_ = iVar20 + uVar104 >> 0x17;
    auVar61._4_4_ = iVar21 + uVar120 >> 0x17;
    auVar61._8_4_ = iVar50 + uVar81 >> 0x17;
    auVar61._12_4_ = iVar52 + uVar83 >> 0x17;
    auVar61 = auVar61 ^ auVar45 ^ auVar31;
    iVar6 = auVar61._0_4_;
    iVar19 = auVar61._4_4_;
    uVar36 = auVar61._8_4_ + iVar50;
    uVar48 = auVar61._12_4_ + iVar52;
    auVar46._0_4_ = (uint)(iVar6 + iVar20) >> 0x13;
    auVar46._4_4_ = (uint)(iVar19 + iVar21) >> 0x13;
    auVar46._8_4_ = uVar36 >> 0x13;
    auVar46._12_4_ = uVar48 >> 0x13;
    auVar32._0_4_ = (iVar6 + iVar20) * 0x2000;
    auVar32._4_4_ = (iVar19 + iVar21) * 0x2000;
    auVar32._8_4_ = uVar36 * 0x2000;
    auVar32._12_4_ = uVar48 * 0x2000;
    auVar33 = (auVar32 | auVar46) ^ auVar33;
    auVar166._0_12_ = auVar33._4_12_;
    auVar166._12_4_ = auVar33._0_4_;
    uVar36 = auVar33._0_4_ + iVar6;
    uVar48 = auVar33._4_4_ + iVar19;
    uVar49 = auVar33._8_4_ + auVar61._8_4_;
    uVar51 = auVar33._12_4_ + auVar61._12_4_;
    auVar148._4_4_ = iVar20;
    auVar148._0_4_ = iVar52;
    auVar148._8_4_ = iVar21;
    auVar148._12_4_ = iVar50;
    uVar104 = (uVar36 * 0x40000 | uVar36 >> 0xe) ^ uVar104;
    uVar120 = (uVar48 * 0x40000 | uVar48 >> 0xe) ^ uVar120;
    uVar81 = (uVar49 * 0x40000 | uVar49 >> 0xe) ^ uVar81;
    uVar83 = (uVar51 * 0x40000 | uVar51 >> 0xe) ^ uVar83;
    auVar16._0_4_ = (iVar52 + uVar104) * 0x80;
    auVar16._4_4_ = (iVar20 + uVar120) * 0x80;
    auVar16._8_4_ = (iVar21 + uVar81) * 0x80;
    auVar16._12_4_ = (iVar50 + uVar83) * 0x80;
    auVar47._0_4_ = iVar52 + uVar104 >> 0x19;
    auVar47._4_4_ = iVar20 + uVar120 >> 0x19;
    auVar47._8_4_ = iVar21 + uVar81 >> 0x19;
    auVar47._12_4_ = iVar50 + uVar83 >> 0x19;
    auVar47 = auVar47 ^ auVar16 ^ auVar166;
    auVar62._0_8_ = auVar61._8_8_;
    auVar62._8_4_ = iVar6;
    auVar62._12_4_ = iVar19;
    uVar36 = auVar47._0_4_;
    uVar48 = auVar47._4_4_;
    uVar49 = auVar47._8_4_;
    uVar51 = auVar47._12_4_;
    auVar146._0_4_ = (uVar36 + uVar104) * 0x200;
    auVar146._4_4_ = (uVar48 + uVar120) * 0x200;
    auVar146._8_4_ = (uVar49 + uVar81) * 0x200;
    auVar146._12_4_ = (uVar51 + uVar83) * 0x200;
    auVar17._0_4_ = uVar36 + uVar104 >> 0x17;
    auVar17._4_4_ = uVar48 + uVar120 >> 0x17;
    auVar17._8_4_ = uVar49 + uVar81 >> 0x17;
    auVar17._12_4_ = uVar51 + uVar83 >> 0x17;
    auVar17 = auVar17 ^ auVar146 ^ auVar62;
    iVar6 = auVar17._0_4_;
    iVar19 = auVar17._4_4_;
    uVar119 = auVar17._8_4_ + uVar49;
    uVar121 = auVar17._12_4_ + uVar51;
    auVar147._0_4_ = (iVar6 + uVar36) * 0x2000;
    auVar147._4_4_ = (iVar19 + uVar48) * 0x2000;
    auVar147._8_4_ = uVar119 * 0x2000;
    auVar147._12_4_ = uVar121 * 0x2000;
    auVar63._0_4_ = iVar6 + uVar36 >> 0x13;
    auVar63._4_4_ = iVar19 + uVar48 >> 0x13;
    auVar63._8_4_ = uVar119 >> 0x13;
    auVar63._12_4_ = uVar121 >> 0x13;
    auVar148 = (auVar147 | auVar63) ^ auVar148;
    auVar161._0_12_ = auVar148._4_12_;
    auVar161._12_4_ = auVar148._0_4_;
    uVar119 = auVar148._0_4_ + iVar6;
    uVar121 = auVar148._4_4_ + iVar19;
    uVar149 = auVar148._8_4_ + auVar17._8_4_;
    uVar150 = auVar148._12_4_ + auVar17._12_4_;
    uVar104 = (uVar119 * 0x40000 | uVar119 >> 0xe) ^ uVar104;
    uVar120 = (uVar121 * 0x40000 | uVar121 >> 0xe) ^ uVar120;
    uVar81 = (uVar149 * 0x40000 | uVar149 >> 0xe) ^ uVar81;
    uVar83 = (uVar150 * 0x40000 | uVar150 >> 0xe) ^ uVar83;
    auVar34._0_4_ = (uVar51 + uVar104) * 0x80;
    auVar34._4_4_ = (uVar36 + uVar120) * 0x80;
    auVar34._8_4_ = (uVar48 + uVar81) * 0x80;
    auVar34._12_4_ = (uVar49 + uVar83) * 0x80;
    auVar64._0_4_ = uVar51 + uVar104 >> 0x19;
    auVar64._4_4_ = uVar36 + uVar120 >> 0x19;
    auVar64._8_4_ = uVar48 + uVar81 >> 0x19;
    auVar64._12_4_ = uVar49 + uVar83 >> 0x19;
    auVar64 = auVar64 ^ auVar34 ^ auVar161;
    iVar50 = auVar64._0_4_;
    iVar52 = auVar64._4_4_;
    iVar163 = auVar64._8_4_;
    iVar164 = auVar64._12_4_;
    auVar18._0_8_ = auVar17._8_8_;
    auVar18._8_4_ = iVar6;
    auVar18._12_4_ = iVar19;
    auVar35._0_4_ = (iVar50 + uVar104) * 0x200;
    auVar35._4_4_ = (iVar52 + uVar120) * 0x200;
    auVar35._8_4_ = (iVar163 + uVar81) * 0x200;
    auVar35._12_4_ = (iVar164 + uVar83) * 0x200;
    auVar162._0_4_ = iVar50 + uVar104 >> 0x17;
    auVar162._4_4_ = iVar52 + uVar120 >> 0x17;
    auVar162._8_4_ = iVar163 + uVar81 >> 0x17;
    auVar162._12_4_ = iVar164 + uVar83 >> 0x17;
    auVar162 = auVar162 ^ auVar35 ^ auVar18;
    iVar6 = auVar162._0_4_;
    iVar19 = auVar162._4_4_;
    iVar20 = auVar162._8_4_;
    iVar21 = auVar162._12_4_;
    uVar51 = ((iVar6 + iVar50) * 0x2000 | (uint)(iVar6 + iVar50) >> 0x13) ^ uVar51;
    uVar36 = ((iVar19 + iVar52) * 0x2000 | (uint)(iVar19 + iVar52) >> 0x13) ^ uVar36;
    uVar48 = ((iVar20 + iVar163) * 0x2000 | (uint)(iVar20 + iVar163) >> 0x13) ^ uVar48;
    uVar49 = ((iVar21 + iVar164) * 0x2000 | (uint)(iVar21 + iVar164) >> 0x13) ^ uVar49;
    uVar119 = uVar51 + iVar6;
    uVar121 = uVar36 + iVar19;
    uVar149 = uVar48 + iVar20;
    uVar150 = uVar49 + iVar21;
    uVar7 = ((uVar119 * 0x40000 | uVar119 >> 0xe) ^ uVar104) + uVar65;
    uVar80 = ((uVar121 * 0x40000 | uVar121 >> 0xe) ^ uVar120) + uVar80;
    uVar82 = ((uVar149 * 0x40000 | uVar149 >> 0xe) ^ uVar81) + uVar82;
    uVar84 = ((uVar150 * 0x40000 | uVar150 >> 0xe) ^ uVar83) + uVar84;
    uVar36 = uVar36 + uVar85;
    uVar48 = uVar48 + uVar101;
    uVar49 = uVar49 + uVar102;
    uVar51 = uVar51 + uVar103;
    pauVar2 = pauVar3 + r * 4 + -3;
    *(uint32_t *)*pauVar2 = uVar7;
    *(uint *)((long)*pauVar2 + 4) = uVar80;
    *(uint *)((long)*pauVar2 + 8) = uVar82;
    *(uint *)((long)*pauVar2 + 0xc) = uVar84;
    pauVar2 = pauVar3 + r * 4 + -2;
    *(uint *)*pauVar2 = uVar36;
    *(uint *)((long)*pauVar2 + 4) = uVar48;
    *(uint *)((long)*pauVar2 + 8) = uVar49;
    *(uint *)((long)*pauVar2 + 0xc) = uVar51;
    auVar37._0_4_ = iVar20 + auVar132._0_4_;
    auVar37._4_4_ = iVar21 + auVar132._4_4_;
    auVar37._8_4_ = iVar6 + auVar132._8_4_;
    auVar37._12_4_ = iVar19 + auVar132._12_4_;
    auVar53._0_4_ = iVar164 + auVar118._0_4_;
    auVar53._4_4_ = iVar50 + auVar118._4_4_;
    auVar53._8_4_ = iVar52 + auVar118._8_4_;
    auVar53._12_4_ = iVar163 + auVar118._12_4_;
    pauVar3[r * 4 + -1] = auVar37;
    pauVar3[r * 4] = auVar53;
    pauVar3 = pauVar3 + 4;
    pauVar4 = pauVar4 + 8;
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  return;
}

Assistant:

static void
blockmix_salsa8(const salsa20_blk_t *restrict Bin,
    salsa20_blk_t *restrict Bout, size_t r)
{
	size_t i;
	__m128i X0, X1, X2, X3;

	r--;
	PREFETCH(&Bin[r * 2 + 1], _MM_HINT_T0)
	for (i = 0; i < r; i++) {
		PREFETCH(&Bin[i * 2], _MM_HINT_T0)
		PREFETCH(&Bin[i * 2 + 1], _MM_HINT_T0)
	}
	PREFETCH(&Bin[r * 2], _MM_HINT_T0)

	/* 1: X <-- B_{2r - 1} */
	X0 = Bin[r * 2 + 1].q[0];
	X1 = Bin[r * 2 + 1].q[1];
	X2 = Bin[r * 2 + 1].q[2];
	X3 = Bin[r * 2 + 1].q[3];

	/* 2: for i = 0 to 2r - 1 do */
	for (i = 0; i <= r; i++) {
		/* 3: X <-- H(X \xor B_i) */
		/* 4: Y_i <-- X */
		/* 6: B' <-- (Y_0, Y_2 ... Y_{2r-2}, Y_1, Y_3 ... Y_{2r-1}) */
		SALSA20_8_XOR_MEM(Bin[i * 2].q, Bout[i].q)

		/* 3: X <-- H(X \xor B_i) */
		/* 4: Y_i <-- X */
		/* 6: B' <-- (Y_0, Y_2 ... Y_{2r-2}, Y_1, Y_3 ... Y_{2r-1}) */
		SALSA20_8_XOR_MEM(Bin[i * 2 + 1].q, Bout[r + 1 + i].q)
	}
}